

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

void __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
GenericValue<rapidjson::CrtAllocator>
          (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,
          GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *rhs,CrtAllocator *allocator,
          bool copyConstStrings)

{
  Type TVar1;
  SizeType SVar2;
  Ch *str;
  StringRefType local_50;
  uint local_3c;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *pGStack_38;
  SizeType i;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *re;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *le;
  SizeType count;
  bool copyConstStrings_local;
  CrtAllocator *allocator_local;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *rhs_local;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  le._7_1_ = copyConstStrings;
  _count = allocator;
  allocator_local = (CrtAllocator *)rhs;
  rhs_local = this;
  TVar1 = GetType(rhs);
  if (TVar1 == kObjectType) {
    DoCopyMembers<rapidjson::CrtAllocator>
              (this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)allocator_local,
               _count,(bool)(le._7_1_ & 1));
  }
  else if (TVar1 == kArrayType) {
    le._0_4_ = *(uint *)allocator_local;
    re = (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
         CrtAllocator::Malloc(_count,(ulong)(uint)le << 4);
    pGStack_38 = GetElementsPointer((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                                    allocator_local);
    for (local_3c = 0; local_3c < (uint)le; local_3c = local_3c + 1) {
      GenericValue<rapidjson::CrtAllocator>
                (re + local_3c,pGStack_38 + local_3c,_count,(bool)(le._7_1_ & 1));
    }
    (this->data_).f.flags = 4;
    (this->data_).s.hashcode = (uint)le;
    (this->data_).s.length = (uint)le;
    SetElementsPointer(this,re);
  }
  else if (TVar1 == kStringType) {
    if ((*(short *)(allocator_local + 0xe) == 0x405) && ((le._7_1_ & 1) == 0)) {
      (this->data_).f.flags = *(uint16_t *)(allocator_local + 0xe);
      (this->data_).n = (Number)*(I *)allocator_local;
      (this->data_).s.str = *(Ch **)(allocator_local + 8);
    }
    else {
      str = GetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                      allocator_local);
      SVar2 = GetStringLength((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                              allocator_local);
      StringRef<char>((rapidjson *)&local_50,str,(ulong)SVar2);
      SetStringRaw(this,&local_50,_count);
    }
  }
  else {
    (this->data_).f.flags = *(uint16_t *)(allocator_local + 0xe);
    (this->data_).n = (Number)*(I *)allocator_local;
    (this->data_).s.str = *(Ch **)(allocator_local + 8);
  }
  return;
}

Assistant:

GenericValue(const GenericValue<Encoding,SourceAllocator>& rhs, Allocator& allocator, bool copyConstStrings = false) {
        switch (rhs.GetType()) {
        case kObjectType:
            DoCopyMembers(rhs, allocator, copyConstStrings);
            break;
        case kArrayType: {
                SizeType count = rhs.data_.a.size;
                GenericValue* le = reinterpret_cast<GenericValue*>(allocator.Malloc(count * sizeof(GenericValue)));
                const GenericValue<Encoding,SourceAllocator>* re = rhs.GetElementsPointer();
                for (SizeType i = 0; i < count; i++)
                    new (&le[i]) GenericValue(re[i], allocator, copyConstStrings);
                data_.f.flags = kArrayFlag;
                data_.a.size = data_.a.capacity = count;
                SetElementsPointer(le);
            }
            break;
        case kStringType:
            if (rhs.data_.f.flags == kConstStringFlag && !copyConstStrings) {
                data_.f.flags = rhs.data_.f.flags;
                data_  = *reinterpret_cast<const Data*>(&rhs.data_);
            }
            else
                SetStringRaw(StringRef(rhs.GetString(), rhs.GetStringLength()), allocator);
            break;
        default:
            data_.f.flags = rhs.data_.f.flags;
            data_  = *reinterpret_cast<const Data*>(&rhs.data_);
            break;
        }
    }